

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O3

VertexHandle __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::add_vertex
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,Vec3f *_point)

{
  pointer *ppVVar1;
  ArrayKernel *this_00;
  iterator __position;
  pointer ppBVar2;
  BaseProperty *pBVar3;
  int iVar4;
  BaseHandle _idx;
  undefined4 extraout_var;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_01;
  reference pvVar5;
  pointer ppBVar6;
  Vertex local_44;
  double local_40;
  double local_38;
  double local_30;
  
  this_00 = (ArrayKernel *)this->mesh_;
  local_40 = (double)CONCAT44(local_40._4_4_,(_point->super_VectorDataT<float,_3>).values_[0]);
  local_38 = (double)CONCAT44(local_38._4_4_,(_point->super_VectorDataT<float,_3>).values_[1]);
  local_30 = (double)CONCAT44(local_30._4_4_,(_point->super_VectorDataT<float,_3>).values_[2]);
  local_44.halfedge_handle_.super_BaseHandle.idx_ = (HalfedgeHandle)(BaseHandle)0xffffffff;
  __position._M_current =
       (this_00->vertices_).
       super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->vertices_).
      super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::
    _M_realloc_insert<OpenMesh::ArrayItems::Vertex>(&this_00->vertices_,__position,&local_44);
  }
  else {
    ((__position._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
    ppVVar1 = &(this_00->vertices_).
               super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  iVar4 = (*(this_00->super_BaseKernel)._vptr_BaseKernel[2])(this_00);
  ppBVar2 = (this_00->super_BaseKernel).vprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar6 = (this_00->super_BaseKernel).vprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar6 != ppBVar2;
      ppBVar6 = ppBVar6 + 1) {
    pBVar3 = *ppBVar6;
    if (pBVar3 != (BaseProperty *)0x0) {
      (*pBVar3->_vptr_BaseProperty[3])(pBVar3,CONCAT44(extraout_var,iVar4));
    }
  }
  local_30 = (double)local_30._0_4_;
  local_38 = (double)local_38._0_4_;
  local_40 = (double)local_40._0_4_;
  _idx.idx_ = (int)ArrayKernel::handle(this_00,(this_00->vertices_).
                                               super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
                                               ._M_impl.super__Vector_impl_data._M_finish + -1);
  this_01 = PropertyContainer::property<OpenMesh::VectorT<double,3>>
                      (&(this_00->super_BaseKernel).vprops_,
                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                       ((BaseHandle *)
                       ((long)&this_00[1].super_BaseKernel.hprops_.properties_.
                               super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4))->idx_);
  pvVar5 = PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](this_01,_idx.idx_);
  (pvVar5->super_VectorDataT<double,_3>).values_[0] = local_40;
  (pvVar5->super_VectorDataT<double,_3>).values_[1] = local_38;
  (pvVar5->super_VectorDataT<double,_3>).values_[2] = local_30;
  return (BaseHandle)(BaseHandle)_idx.idx_;
}

Assistant:

virtual VertexHandle add_vertex(const Vec3f& _point)
  {
    return mesh_.add_vertex(vector_cast<Point>(_point));
  }